

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O3

void __thiscall QtMWidgets::Picker::mouseReleaseEvent(Picker *this,QMouseEvent *event)

{
  int iVar1;
  int iVar2;
  QMouseEvent QVar3;
  PickerPrivate *this_00;
  double dVar4;
  double in_XMM1_Qa;
  QPoint local_28;
  
  if (*(int *)(event + 0x40) == 1) {
    this_00 = (this->d).d;
    this_00->leftMouseButtonPressed = false;
    if (this_00->mouseWasMoved == true) {
      iVar1 = this_00->mouseMoveDelta;
      iVar2 = FingerGeometry::touchBounce();
      QVar3 = (QMouseEvent)0x1;
      if (iVar2 < iVar1) goto LAB_001719a2;
      this_00 = (this->d).d;
    }
    dVar4 = (double)QEventPoint::position();
    local_28.xp = (int)((double)((ulong)dVar4 & 0x8000000000000000 | 0x3fe0000000000000) + dVar4);
    local_28.yp = (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                       in_XMM1_Qa);
    PickerPrivate::setCurrentIndex(this_00,&local_28);
    QVar3 = (QMouseEvent)0x1;
  }
  else {
    QVar3 = (QMouseEvent)0x0;
  }
LAB_001719a2:
  event[0xc] = QVar3;
  return;
}

Assistant:

void
Picker::mouseReleaseEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		d->leftMouseButtonPressed = false;

		if( !d->mouseWasMoved
			|| d->mouseMoveDelta <= FingerGeometry::touchBounce() )
				d->setCurrentIndex( event->pos() );

		event->accept();
	}
	else
		event->ignore();
}